

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

QString * __thiscall
QRegularExpression::wildcardToRegularExpression
          (QString *__return_storage_ptr__,QRegularExpression *this,QStringView pattern,
          WildcardConversionOptions options)

{
  ArrayOptions *pAVar1;
  QChar ch;
  short sVar2;
  long lVar3;
  Data *pDVar4;
  QArrayData *data;
  bool bVar5;
  QStringView expression;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  QRegularExpression *pQVar9;
  long lVar10;
  QRegularExpression *pQVar11;
  QRegularExpression *pQVar12;
  long in_FS_OFFSET;
  short local_84;
  QChar *local_78;
  qsizetype local_70;
  QChar *local_68;
  qsizetype local_60;
  Data *in_stack_ffffffffffffffa8;
  storage_type_conflict *in_stack_ffffffffffffffb0;
  qsizetype local_48;
  
  lVar8 = pattern.m_size;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar9 = (QRegularExpression *)((long)&this[1].d.d.ptr + 7);
  if (-1 < (long)this) {
    pQVar9 = this;
  }
  lVar10 = (long)&(this->d).d.ptr + ((long)pQVar9 >> 4);
  if (lVar10 < 1) {
    lVar10 = 0;
  }
  QString::reallocData(__return_storage_ptr__,lVar10,KeepSize);
  pDVar4 = (__return_storage_ptr__->d).d;
  if ((pDVar4 != (Data *)0x0) && ((pDVar4->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar4->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  if (((undefined1  [16])pattern & (undefined1  [16])0x2) == (undefined1  [16])0x0) {
    local_84 = 0x2f;
    local_60 = 5;
    local_68 = (QChar *)0x595a52;
    local_70 = 4;
    local_78 = (QChar *)0x595a5e;
  }
  else {
    local_60 = 2;
    local_68 = (QChar *)0x595a4c;
    local_70 = 1;
    local_78 = (QChar *)0x4e5ea2;
    local_84 = 0;
  }
  QString::append(__return_storage_ptr__,(QChar *)L"(?s:",4);
  bVar6 = false;
  pQVar9 = (QRegularExpression *)0x0;
  do {
    if ((long)this <= (long)pQVar9) {
      QString::append(__return_storage_ptr__,(QChar *)0x4d9152,1);
      if (((undefined1  [16])pattern & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        expression.m_data = in_stack_ffffffffffffffb0;
        expression.m_size = (qsizetype)in_stack_ffffffffffffffa8;
        anchoredPattern(expression);
        data = &((__return_storage_ptr__->d).d)->super_QArrayData;
        (__return_storage_ptr__->d).d = in_stack_ffffffffffffffa8;
        (__return_storage_ptr__->d).ptr = in_stack_ffffffffffffffb0;
        (__return_storage_ptr__->d).size = local_48;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,2,0x10);
          }
        }
      }
      goto LAB_003fd8eb;
    }
    pQVar11 = (QRegularExpression *)((long)&(pQVar9->d).d.ptr + 1);
    ch.ucs = *(char16_t *)(lVar8 + (long)pQVar9 * 2);
    pQVar12 = pQVar11;
    if ((ushort)ch.ucs < 0x2b) {
      if (((ushort)ch.ucs - 0x28 < 2) || (ch.ucs == L'$')) goto LAB_003fd7d9;
      if ((ushort)ch.ucs == 0x2a) {
        QString::append(__return_storage_ptr__,local_68,local_60);
        bVar5 = true;
        if ((long)pQVar11 < (long)this) {
          do {
            pQVar12 = pQVar11;
            if (*(short *)(lVar8 + (long)pQVar11 * 2) != 0x2a) break;
            pQVar11 = (QRegularExpression *)((long)&(pQVar11->d).d.ptr + 1);
            pQVar12 = this;
          } while (this != pQVar11);
        }
        goto LAB_003fd7f8;
      }
LAB_003fd7e8:
      bVar5 = true;
      QString::append(__return_storage_ptr__,ch);
    }
    else {
      uVar7 = (ulong)((ushort)ch.ucs - 0x2b);
      if (0x33 < (ushort)ch.ucs - 0x2b) {
LAB_003fd7d1:
        if (2 < (ushort)ch.ucs - 0x7b) goto LAB_003fd7e8;
LAB_003fd7d9:
        QString::append(__return_storage_ptr__,(QChar)0x5c);
        goto LAB_003fd7e8;
      }
      if ((0xa000000000009U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_003fd7d9;
      if (uVar7 == 0x14) {
        bVar5 = true;
        QString::append(__return_storage_ptr__,local_78,local_70);
      }
      else {
        if (uVar7 != 0x30) goto LAB_003fd7d1;
        QString::append(__return_storage_ptr__,ch);
        bVar5 = true;
        if ((long)pQVar11 < (long)this) {
          if (*(short *)(lVar8 + 2 + (long)pQVar9 * 2) == 0x21) {
            QString::append(__return_storage_ptr__,(QChar)0x5e);
            pQVar11 = (QRegularExpression *)((long)&(pQVar9->d).d.ptr + 2);
          }
          if (((long)pQVar11 < (long)this) && (*(short *)(lVar8 + (long)pQVar11 * 2) == 0x5d)) {
            QString::append(__return_storage_ptr__,(QChar)0x5d);
            pQVar11 = (QRegularExpression *)((long)&(pQVar11->d).d.ptr + 1);
          }
          while( true ) {
            pQVar12 = pQVar11;
            if (((long)this <= (long)pQVar11) ||
               (sVar2 = *(short *)(lVar8 + (long)pQVar11 * 2), sVar2 == 0x5d)) goto LAB_003fd7f8;
            if ((((undefined1  [16])pattern & (undefined1  [16])0x2) == (undefined1  [16])0x0) &&
               ((sVar2 == 0x2f || (sVar2 == local_84)))) break;
            if (sVar2 == 0x5c) {
              QString::append(__return_storage_ptr__,(QChar)0x5c);
            }
            lVar10 = (long)pQVar11 * 2;
            pQVar11 = (QRegularExpression *)((long)&(pQVar11->d).d.ptr + 1);
            QString::append(__return_storage_ptr__,(QChar)*(char16_t *)(lVar8 + lVar10));
          }
          bVar5 = false;
          bVar6 = true;
        }
      }
    }
LAB_003fd7f8:
    pQVar9 = pQVar12;
  } while (bVar5);
  if ((!bVar6) && (pDVar4 = (__return_storage_ptr__->d).d, pDVar4 != (Data *)0x0)) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
        return __return_storage_ptr__;
      }
      goto LAB_003fd94e;
    }
  }
LAB_003fd8eb:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __return_storage_ptr__;
  }
LAB_003fd94e:
  __stack_chk_fail();
}

Assistant:

QString QRegularExpression::wildcardToRegularExpression(QStringView pattern, WildcardConversionOptions options)
{
    const qsizetype wclen = pattern.size();
    QString rx;
    rx.reserve(wclen + wclen / 16);
    qsizetype i = 0;
    const QChar *wc = pattern.data();

    struct GlobSettings {
        char16_t nativePathSeparator;
        QStringView starEscape;
        QStringView questionMarkEscape;
    };

    const GlobSettings settings = [options]() {
        if (options.testFlag(NonPathWildcardConversion)) {
            return GlobSettings{ u'\0', u".*", u"." };
        } else {
#ifdef Q_OS_WIN
            return GlobSettings{ u'\\', u"[^/\\\\]*", u"[^/\\\\]" };
#else
            return GlobSettings{ u'/', u"[^/]*", u"[^/]" };
#endif
        }
    }();

    // We want a dot to match everything (incl. newlines), so enable /s mode,
    // limited to the pattern string we're producing.
    rx += u"(?s:";

    while (i < wclen) {
        const QChar c = wc[i++];
        switch (c.unicode()) {
        case '*':
            rx += settings.starEscape;
            // Coalesce sequences of *
            while (i < wclen && wc[i] == u'*')
                ++i;
            break;
        case '?':
            rx += settings.questionMarkEscape;
            break;
        // When not using filepath globbing: \ is escaped, / is itself
        // When using filepath globbing:
        // * Unix: \ gets escaped. / is itself
        // * Windows: \ and / can match each other -- they become [/\\] in regexp
        case '\\':
#ifdef Q_OS_WIN
            if (options.testFlag(NonPathWildcardConversion))
                rx += u"\\\\";
            else
                rx += u"[/\\\\]";
            break;
        case '/':
            if (options.testFlag(NonPathWildcardConversion))
                rx += u'/';
            else
                rx += u"[/\\\\]";
            break;
#endif
        case '$':
        case '(':
        case ')':
        case '+':
        case '.':
        case '^':
        case '{':
        case '|':
        case '}':
            rx += u'\\';
            rx += c;
            break;
        case '[':
            rx += c;
            // Support for the [!abc] or [!a-c] syntax
            if (i < wclen) {
                if (wc[i] == u'!') {
                    rx += u'^';
                    ++i;
                }

                if (i < wclen && wc[i] == u']')
                    rx += wc[i++];

                while (i < wclen && wc[i] != u']') {
                    if (!options.testFlag(NonPathWildcardConversion)) {
                        // The '/' appearing in a character class invalidates the
                        // regular expression parsing. It also concerns '\\' on
                        // Windows OS types.
                        if (wc[i] == u'/' || wc[i] == settings.nativePathSeparator)
                            return rx;
                    }
                    if (wc[i] == u'\\')
                        rx += u'\\';
                    rx += wc[i++];
                }
            }
            break;
        default:
            rx += c;
            break;
        }
    }

    // Closes the (?s: group opened above
    rx += u")";

    if (!(options & UnanchoredWildcardConversion))
        rx = anchoredPattern(rx);

    return rx;
}